

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

FaceIter __thiscall CMU462::HalfedgeMesh::newBoundary(HalfedgeMesh *this)

{
  iterator iVar1;
  Face local_c8;
  
  local_c8.super_HalfedgeElement._vptr_HalfedgeElement = (_func_int **)&PTR_centroid_00274d08;
  memset(&local_c8.newPosition,0,0xa0);
  local_c8._isBoundary = true;
  iVar1 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::emplace<CMU462::Face>
                    (&this->boundaries,(const_iterator)&this->boundaries,&local_c8);
  return (FaceIter)iVar1._M_node;
}

Assistant:

FaceIter newBoundary() {
          return boundaries.insert(boundaries.end(), Face(true));
        }